

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

void * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::reentrant_put_transaction<Msg>::try_raw_allocate
          (reentrant_put_transaction<Msg> *this,progress_guarantee i_progress_guarantee,
          size_t i_size,size_t i_alignment)

{
  bool bVar1;
  undefined1 local_40 [8];
  Allocation push_data;
  size_t i_alignment_local;
  size_t i_size_local;
  progress_guarantee i_progress_guarantee_local;
  reentrant_put_transaction<Msg> *this_local;
  
  push_data.m_user_storage = (void *)i_alignment;
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x882);
  }
  detail::
  LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  ::try_inplace_allocate
            ((Allocation *)local_40,
             (LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
              *)this->m_queue,i_progress_guarantee,2,false,i_size,(size_t)push_data.m_user_storage);
  return (void *)push_data.m_next_ptr;
}

Assistant:

void * try_raw_allocate(
              progress_guarantee i_progress_guarantee, size_t i_size, size_t i_alignment) noexcept
            {
                DENSITY_ASSERT(!empty());
                auto push_data = m_queue->try_inplace_allocate(
                  i_progress_guarantee, detail::LfQueue_Dead, false, i_size, i_alignment);
                return push_data.m_user_storage;
            }